

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xpath_node_set::_assign
          (xpath_node_set *this,const_iterator begin_,const_iterator end_,type_t type_)

{
  ulong uVar1;
  bad_alloc *this_00;
  xpath_node *local_48;
  xpath_node *storage;
  size_t size_;
  type_t type__local;
  const_iterator end__local;
  const_iterator begin__local;
  xpath_node_set *this_local;
  
  if (end_ < begin_) {
    __assert_fail("begin_ <= end_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x2f68,
                  "void pugi::xpath_node_set::_assign(const_iterator, const_iterator, type_t)");
  }
  uVar1 = (long)end_ - (long)begin_ >> 4;
  if (uVar1 < 2) {
    local_48 = this->_storage;
  }
  else {
    local_48 = (xpath_node *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(uVar1 << 4);
  }
  if (local_48 == (xpath_node *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (this->_begin != this->_storage) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (this->_begin);
  }
  if (uVar1 != 0) {
    memcpy(local_48,begin_,uVar1 << 4);
  }
  this->_begin = local_48;
  this->_end = local_48 + uVar1;
  this->_type = type_;
  return;
}

Assistant:

PUGI__FN void xpath_node_set::_assign(const_iterator begin_, const_iterator end_, type_t type_)
	{
		assert(begin_ <= end_);

		size_t size_ = static_cast<size_t>(end_ - begin_);

		// use internal buffer for 0 or 1 elements, heap buffer otherwise
		xpath_node* storage = (size_ <= 1) ? _storage : static_cast<xpath_node*>(impl::xml_memory::allocate(size_ * sizeof(xpath_node)));

		if (!storage)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return;
		#else
			throw std::bad_alloc();
		#endif
		}

		// deallocate old buffer
		if (_begin != _storage)
			impl::xml_memory::deallocate(_begin);

		// size check is necessary because for begin_ = end_ = nullptr, memcpy is UB
		if (size_)
			memcpy(storage, begin_, size_ * sizeof(xpath_node));

		_begin = storage;
		_end = storage + size_;
		_type = type_;
	}